

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

void Rescale(CPpmd7 *p)

{
  CPpmd_Void_Ref *pCVar1;
  Byte BVar2;
  ushort uVar3;
  CPpmd_State_Ref CVar4;
  CPpmd_State *pCVar5;
  Byte *pBVar6;
  bool bVar7;
  Byte BVar8;
  UInt16 UVar9;
  Byte BVar10;
  UInt16 UVar11;
  undefined1 uVar12;
  undefined2 uVar13;
  CPpmd7_Context *pCVar14;
  uint uVar15;
  Byte *pBVar16;
  CPpmd_State *pCVar17;
  uint uVar18;
  UInt32 n;
  int iVar19;
  byte bVar20;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  UInt16 UVar25;
  uint uVar26;
  CPpmd_State *pCVar27;
  CPpmd_State *ptr;
  uint uVar28;
  CPpmd_State tmp;
  
  pCVar5 = p->FoundState;
  ptr = (CPpmd_State *)(p->Base + p->MinContext->Stats);
  UVar25 = pCVar5->SuccessorHigh;
  BVar2 = pCVar5->Symbol;
  BVar10 = pCVar5->Freq;
  UVar11 = pCVar5->SuccessorLow;
  for (; pCVar5 != ptr; pCVar5 = pCVar5 + -1) {
    pCVar5->SuccessorHigh = pCVar5[-1].SuccessorHigh;
    BVar8 = pCVar5[-1].Freq;
    UVar9 = pCVar5[-1].SuccessorLow;
    pCVar5->Symbol = pCVar5[-1].Symbol;
    pCVar5->Freq = BVar8;
    pCVar5->SuccessorLow = UVar9;
  }
  pCVar5->SuccessorHigh = UVar25;
  pCVar5->Symbol = BVar2;
  pCVar5->Freq = BVar10;
  pCVar5->SuccessorLow = UVar11;
  pCVar14 = p->MinContext;
  uVar3 = pCVar14->SummFreq;
  bVar20 = pCVar5->Freq;
  uVar26 = (uint)(p->OrderFall != 0);
  uVar18 = (bVar20 + 4 & 0xff) + uVar26 >> 1;
  pCVar5->Freq = (Byte)uVar18;
  iVar19 = pCVar14->NumStats - 1;
  pBVar6 = &pCVar5->Freq;
  uVar28 = (uint)uVar3 - (uint)bVar20;
  do {
    uVar15 = uVar28;
    pBVar16 = pBVar6;
    pCVar17 = pCVar5;
    bVar20 = pCVar17[1].Freq;
    uVar24 = bVar20 + uVar26 >> 1;
    bVar23 = (byte)uVar24;
    pCVar17[1].Freq = bVar23;
    if (pCVar17->Freq < uVar24) {
      BVar2 = pCVar17[1].Symbol;
      UVar25 = pCVar17[1].SuccessorLow;
      UVar11 = pCVar17[1].SuccessorHigh;
      pCVar5 = pCVar17;
      do {
        pCVar27 = pCVar5;
        pCVar27[1].SuccessorHigh = pCVar27->SuccessorHigh;
        BVar10 = pCVar27->Freq;
        UVar9 = pCVar27->SuccessorLow;
        pCVar27[1].Symbol = pCVar27->Symbol;
        pCVar27[1].Freq = BVar10;
        pCVar27[1].SuccessorLow = UVar9;
        if (pCVar27 == ptr) break;
        pCVar5 = pCVar27 + -1;
      } while (pCVar27[-1].Freq < bVar23);
      pCVar27->Symbol = BVar2;
      pCVar27->Freq = bVar23;
      pCVar27->SuccessorLow = UVar25;
      pCVar27->SuccessorHigh = UVar11;
    }
    uVar28 = uVar15 - bVar20;
    uVar18 = uVar18 + uVar24;
    iVar19 = iVar19 + -1;
    pCVar5 = pCVar17 + 1;
    pBVar6 = pBVar16 + 6;
  } while (iVar19 != 0);
  pCVar14 = p->MinContext;
  if (pCVar17[1].Freq == '\0') {
    uVar24 = (uint)pCVar14->NumStats;
    uVar28 = uVar15 - bVar20;
    uVar26 = uVar24;
    do {
      uVar26 = uVar26 - 1;
      uVar28 = uVar28 + 1;
      BVar2 = *pBVar16;
      pBVar16 = pBVar16 + -6;
    } while (BVar2 == '\0');
    UVar25 = (UInt16)uVar26;
    pCVar14->NumStats = UVar25;
    if (UVar25 == 1) {
      BVar2 = ptr->Symbol;
      bVar20 = ptr->Freq;
      CVar4 = *(CPpmd_State_Ref *)&ptr->SuccessorLow;
      uVar26 = uVar28;
      do {
        bVar20 = bVar20 - (bVar20 >> 1);
        uVar28 = uVar26 >> 1;
        bVar7 = 3 < uVar26;
        uVar26 = uVar28;
      } while (bVar7);
      bVar23 = p->Units2Indx[(uVar24 + 1 >> 1) - 1];
      pCVar1 = p->FreeList + bVar23;
      uVar12 = *(undefined1 *)((long)pCVar1 + 1);
      uVar13 = *(undefined2 *)((long)pCVar1 + 2);
      ptr->Symbol = *(undefined1 *)pCVar1;
      ptr->Freq = uVar12;
      ptr->SuccessorLow = uVar13;
      p->FreeList[bVar23] = (int)ptr - *(int *)&p->Base;
      p->FoundState = (CPpmd_State *)&pCVar14->SummFreq;
      *(Byte *)&pCVar14->SummFreq = BVar2;
      *(byte *)((long)&pCVar14->SummFreq + 1) = bVar20;
      pCVar14->Stats = CVar4;
    }
    else {
      uVar24 = uVar24 + 1 >> 1;
      uVar26 = (uVar26 & 0xffff) + 1 >> 1;
      if (uVar24 == uVar26) goto LAB_004d84f7;
      if (p->Units2Indx[uVar24 - 1] != p->Units2Indx[uVar26 - 1]) {
        uVar15 = (uint)p->Units2Indx[uVar26 - 1];
        uVar22 = (ulong)p->FreeList[uVar15];
        uVar24 = (uint)p->Units2Indx[uVar24 - 1];
        if (uVar22 == 0) {
          SplitBlock(p,ptr,uVar24,uVar15);
          pCVar14 = p->MinContext;
        }
        else {
          pBVar6 = p->Base;
          pCVar5 = (CPpmd_State *)(pBVar6 + uVar22);
          p->FreeList[uVar15] = *(CPpmd_Void_Ref *)(pBVar6 + uVar22);
          lVar21 = 0;
          do {
            *(undefined4 *)(&pCVar5->Symbol + lVar21) = *(undefined4 *)(&ptr->Symbol + lVar21);
            *(undefined4 *)((long)&pCVar5->SuccessorHigh + lVar21) =
                 *(undefined4 *)((long)&ptr->SuccessorHigh + lVar21);
            *(undefined4 *)((long)&pCVar5[1].SuccessorLow + lVar21) =
                 *(undefined4 *)((long)&ptr[1].SuccessorLow + lVar21);
            lVar21 = lVar21 + 0xc;
            uVar26 = uVar26 - 1;
          } while (uVar26 != 0);
          pCVar1 = p->FreeList + uVar24;
          uVar12 = *(undefined1 *)((long)pCVar1 + 1);
          uVar13 = *(undefined2 *)((long)pCVar1 + 2);
          ptr->Symbol = *(undefined1 *)pCVar1;
          ptr->Freq = uVar12;
          ptr->SuccessorLow = uVar13;
          p->FreeList[uVar24] = (int)ptr - (int)pBVar6;
          ptr = pCVar5;
        }
      }
      pCVar14->Stats = (int)ptr - *(int *)&p->Base;
    }
    if (UVar25 == 1) {
      return;
    }
    pCVar14 = p->MinContext;
  }
LAB_004d84f7:
  pCVar14->SummFreq = ((short)uVar18 + (short)uVar28) - (short)(uVar28 >> 1);
  p->FoundState = (CPpmd_State *)(p->Base + pCVar14->Stats);
  return;
}

Assistant:

static void Rescale(CPpmd7 *p)
{
  unsigned i, adder, sumFreq, escFreq;
  CPpmd_State *stats = STATS(p->MinContext);
  CPpmd_State *s = p->FoundState;
  {
    CPpmd_State tmp = *s;
    for (; s != stats; s--)
      s[0] = s[-1];
    *s = tmp;
  }
  escFreq = p->MinContext->SummFreq - s->Freq;
  s->Freq += 4;
  adder = (p->OrderFall != 0);
  s->Freq = (Byte)((s->Freq + adder) >> 1);
  sumFreq = s->Freq;
  
  i = p->MinContext->NumStats - 1;
  do
  {
    escFreq -= (++s)->Freq;
    s->Freq = (Byte)((s->Freq + adder) >> 1);
    sumFreq += s->Freq;
    if (s[0].Freq > s[-1].Freq)
    {
      CPpmd_State *s1 = s;
      CPpmd_State tmp = *s1;
      do
        s1[0] = s1[-1];
      while (--s1 != stats && tmp.Freq > s1[-1].Freq);
      *s1 = tmp;
    }
  }
  while (--i);
  
  if (s->Freq == 0)
  {
    unsigned numStats = p->MinContext->NumStats;
    unsigned n0, n1;
    do { i++; } while ((--s)->Freq == 0);
    escFreq += i;
    p->MinContext->NumStats = (UInt16)(p->MinContext->NumStats - i);
    if (p->MinContext->NumStats == 1)
    {
      CPpmd_State tmp = *stats;
      do
      {
        tmp.Freq = (Byte)(tmp.Freq - (tmp.Freq >> 1));
        escFreq >>= 1;
      }
      while (escFreq > 1);
      InsertNode(p, stats, U2I(((numStats + 1) >> 1)));
      *(p->FoundState = ONE_STATE(p->MinContext)) = tmp;
      return;
    }
    n0 = (numStats + 1) >> 1;
    n1 = (p->MinContext->NumStats + 1) >> 1;
    if (n0 != n1)
      p->MinContext->Stats = STATS_REF(ShrinkUnits(p, stats, n0, n1));
  }
  p->MinContext->SummFreq = (UInt16)(sumFreq + escFreq - (escFreq >> 1));
  p->FoundState = STATS(p->MinContext);
}